

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O0

void __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::buildTree
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *freq,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *alphabet,uint pos,uint this_node,
          uint *next_free_node)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  byte *pbVar6;
  uint in_ECX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *in_RSI;
  long in_RDI;
  uint in_R8D;
  int *in_R9;
  reference rVar7;
  uint i_1;
  uint i;
  ulint size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> alphabet1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> alphabet0;
  bitvector_t<4096UL,_(bv::allocation_policy_t)0> *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  reference in_stack_fffffffffffffe48;
  value_type in_stack_fffffffffffffe50;
  value_type in_stack_fffffffffffffe52;
  uint in_stack_fffffffffffffe54;
  size_t in_stack_fffffffffffffe58;
  bitvector_t<4096UL,_(bv::allocation_policy_t)0> *in_stack_fffffffffffffe60;
  value_type in_stack_fffffffffffffe80;
  value_type in_stack_fffffffffffffe82;
  uint in_stack_fffffffffffffe84;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe88;
  reference in_stack_fffffffffffffe90;
  reference local_98;
  uint local_84;
  uint local_64;
  long local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  uint *in_stack_ffffffffffffffd0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *freq_00;
  
  freq_00 = in_RDX;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1431b3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1431c0);
  local_60 = 0;
  for (local_64 = 0; uVar2 = (ulong)local_64,
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDX),
      uVar2 < sVar3; local_64 = local_64 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (size_type)in_stack_fffffffffffffe38);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                        (size_type)in_stack_fffffffffffffe38);
    local_60 = *pvVar4 + local_60;
  }
  bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::bitvector_t
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             CONCAT44(in_stack_fffffffffffffe54,
                      CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)));
  std::
  vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
  ::operator[]((vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                *)(in_RDI + 0x38),(ulong)in_R8D);
  bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::operator=
            ((bitvector_t<4096UL,_(bv::allocation_policy_t)0> *)
             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38
            );
  bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::~bitvector_t
            ((bitvector_t<4096UL,_(bv::allocation_policy_t)0> *)0x1432e8);
  local_84 = 0;
  while( true ) {
    uVar2 = (ulong)local_84;
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDX);
    if (sVar3 <= uVar2) break;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (size_type)in_stack_fffffffffffffe38);
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::at((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
          *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
         (size_type)in_stack_fffffffffffffe38);
    rVar7 = std::vector<bool,_std::allocator<bool>_>::at
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       (size_type)in_stack_fffffffffffffe38);
    local_98 = rVar7;
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_98);
    if (bVar1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 (size_type)in_stack_fffffffffffffe38);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::at((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
           (size_type)in_stack_fffffffffffffe38);
      sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                        ((vector<bool,_std::allocator<bool>_> *)
                         CONCAT44(in_stack_fffffffffffffe84,
                                  CONCAT22(in_stack_fffffffffffffe82,in_stack_fffffffffffffe80)));
      if (sVar3 - 1 == (ulong)in_ECX) {
        in_stack_fffffffffffffe54 = (uint)*(byte *)(in_RDI + 1);
        pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                            (size_type)in_stack_fffffffffffffe38);
        in_stack_fffffffffffffe52 = (short)in_stack_fffffffffffffe54 + (ushort)*pbVar6;
        pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (in_RDI + 0x20),(ulong)in_R8D);
        *pvVar5 = in_stack_fffffffffffffe52;
      }
      else {
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_58);
        if (sVar3 == 0) {
          in_stack_fffffffffffffe50 = (value_type)*in_R9;
          pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                              (in_RDI + 0x20),(ulong)in_R8D);
          *pvVar5 = in_stack_fffffffffffffe50;
          *in_R9 = *in_R9 + 1;
        }
        in_stack_fffffffffffffe48 =
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                        (size_type)in_stack_fffffffffffffe38);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffffe54,
                            CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)),
                   in_stack_fffffffffffffe48);
      }
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 (size_type)in_stack_fffffffffffffe38);
      in_stack_fffffffffffffe90 =
           std::
           vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ::at((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                (size_type)in_stack_fffffffffffffe38);
      sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                        ((vector<bool,_std::allocator<bool>_> *)
                         CONCAT44(in_stack_fffffffffffffe84,
                                  CONCAT22(in_stack_fffffffffffffe82,in_stack_fffffffffffffe80)));
      if (sVar3 - 1 == (ulong)in_ECX) {
        in_stack_fffffffffffffe84 = (uint)*(byte *)(in_RDI + 1);
        in_stack_fffffffffffffe88 =
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                        (size_type)in_stack_fffffffffffffe38);
        in_stack_fffffffffffffe82 =
             (short)in_stack_fffffffffffffe84 +
             (ushort)*(byte *)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                &in_stack_fffffffffffffe88->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                               ->_M_impl).super__Vector_impl_data._M_start;
        pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 8),
                            (ulong)in_R8D);
        *pvVar5 = in_stack_fffffffffffffe82;
      }
      else {
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &stack0xffffffffffffffc0);
        if (sVar3 == 0) {
          in_stack_fffffffffffffe80 = (value_type)*in_R9;
          pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                              (in_RDI + 8),(ulong)in_R8D);
          *pvVar5 = in_stack_fffffffffffffe80;
          *in_R9 = *in_R9 + 1;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   (size_type)in_stack_fffffffffffffe38);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffffe54,
                            CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)),
                   in_stack_fffffffffffffe48);
      }
    }
    local_84 = local_84 + 1;
  }
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &stack0xffffffffffffffc0);
  if (sVar3 != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe90,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe88);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe88);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 8),(ulong)in_R8D
              );
    buildTree(in_RSI,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)freq_00,
              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(in_ECX,in_R8D),
              (uint)((ulong)in_R9 >> 0x20),(uint)in_R9,in_stack_ffffffffffffffd0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffe54,
                        CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffe54,
                        CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)));
  }
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_58);
  if (sVar3 != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe90,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe88);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe88);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x20),
               (ulong)in_R8D);
    buildTree(in_RSI,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)freq_00,
              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(in_ECX,in_R8D),
              (uint)((ulong)in_R9 >> 0x20),(uint)in_R9,in_stack_ffffffffffffffd0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffe54,
                        CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffe54,
                        CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)));
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe54,
                      CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe54,
                      CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)));
  return;
}

Assistant:

void buildTree(vector<ulint> freq,vector<symbol> alphabet,uint pos,uint this_node, uint * next_free_node){

		vector<symbol> alphabet0;
		vector<symbol> alphabet1;

		ulint size = 0;//size of the current bitvector

		for(uint i=0;i<alphabet.size();i++){

			size += freq.at(alphabet.at(i));

		}

		wavelet_tree[this_node] = bitvector_type(size);

		for(uint i=0;i<alphabet.size();i++){

			if(codes.at(alphabet.at(i)).at(pos)==0){//left (bit 0)

				if(codes.at(alphabet.at(i)).size()-1==pos){//leaf on left: save character

					child0[this_node] = sigma+alphabet.at(i);

				}else{

					if(alphabet0.size()==0){//if this is the first symbol seen with bit 0, allocate new tree node
						child0[this_node] = *next_free_node;
						*next_free_node += 1;
					}

					alphabet0.push_back(alphabet.at(i));

				}

			}else{//right (bit 1)

				if(codes.at(alphabet.at(i)).size()-1==pos){//leaf on right: save character

					child1[this_node] = sigma+alphabet.at(i);

				}else{

					if(alphabet1.size()==0){//if this is the first symbol seen with bit 1, allocate new tree node
						child1[this_node] = *next_free_node;
						*next_free_node += 1;
					}

					alphabet1.push_back(alphabet.at(i));

				}

			}

		}

		if(alphabet0.size()>0)
			buildTree(freq,alphabet0,pos+1,child0[this_node],next_free_node);

		if(alphabet1.size()>0)
			buildTree(freq,alphabet1,pos+1,child1[this_node],next_free_node);


	}